

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.h
# Opt level: O3

DynamicType * __thiscall Js::ConstructorCache::GetType(ConstructorCache *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicType *pDVar4;
  
  pDVar4 = (DynamicType *)(this->super_PropertyGuard).value;
  if (((ulong)pDVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/ConstructorCache.h"
                                ,0x58,
                                "(static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0)"
                                ,
                                "static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pDVar4 = (DynamicType *)(this->super_PropertyGuard).value;
  }
  return pDVar4;
}

Assistant:

DynamicType* GetType() const
        {
            Assert(static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0);
            return reinterpret_cast<DynamicType*>(__super::GetValue());
        }